

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O0

void __thiscall Scanner::add_tok(Scanner *this,token tok_type)

{
  undefined1 local_40 [8];
  tok temp;
  token tok_type_local;
  Scanner *this_local;
  
  temp._36_4_ = tok_type;
  tok::tok((tok *)local_40);
  std::__cxx11::string::operator=((string *)&temp,(string *)&this->tstr);
  local_40._4_4_ = temp._36_4_;
  local_40._0_4_ = this->lines;
  std::vector<tok,_std::allocator<tok>_>::push_back(&this->toks,(value_type *)local_40);
  tok::~tok((tok *)local_40);
  return;
}

Assistant:

void Scanner::add_tok(token tok_type)
{
  tok temp;
  temp.s = tstr;
  temp.t = tok_type;
  temp.line = lines;
  (toks).push_back(temp);
}